

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowNthValueExecutor::EvaluateInternal
          (WindowNthValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  idx_t in_RCX;
  undefined8 in_RDX;
  DataChunk *in_RSI;
  idx_t in_R8;
  SubFrames *in_R9;
  anon_class_48_6_d1362d0e in_stack_00000000;
  WindowInputExpression nth_col;
  WindowExcludeMode exclude_mode;
  ValidityMask *ignore_nulls;
  SubFrames *frames;
  DataChunk *bounds;
  WindowCursor *cursor;
  WindowValueLocalState *lvstate;
  WindowValueGlobalState *gvstate;
  WindowExecutorState *in_stack_ffffffffffffff20;
  column_t in_stack_ffffffffffffff30;
  DataChunk *in_stack_ffffffffffffff38;
  WindowInputExpression *in_stack_ffffffffffffff40;
  WindowExcludeMode exclude_mode_00;
  
  exclude_mode_00 = (WindowExcludeMode)((ulong)in_RDX >> 0x38);
  WindowExecutorState::Cast<duckdb::WindowValueGlobalState>(in_stack_ffffffffffffff20);
  WindowExecutorState::Cast<duckdb::WindowValueLocalState>(in_stack_ffffffffffffff20);
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator*
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             in_stack_ffffffffffffff20);
  optional_ptr<duckdb::ValidityMask,_true>::operator*
            ((optional_ptr<duckdb::ValidityMask,_true> *)in_stack_ffffffffffffff20);
  WindowInputExpression::WindowInputExpression
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  WindowAggregator::
  EvaluateSubFrames<duckdb::WindowNthValueExecutor::EvaluateInternal(duckdb::WindowExecutorGlobalState&,duckdb::WindowExecutorLocalState&,duckdb::DataChunk&,duckdb::Vector&,unsigned_long,unsigned_long)const::__0>
            (in_RSI,exclude_mode_00,in_RCX,in_R8,in_R9,in_stack_00000000);
  return;
}

Assistant:

void WindowNthValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	D_ASSERT(cursor.chunk.ColumnCount() == 1);
	WindowInputExpression nth_col(eval_chunk, nth_idx);
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Returns value evaluated at the row that is the n'th row of the window frame (counting from 1);
		// returns NULL if there is no such row.
		if (nth_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
			return;
		}
		auto n_param = nth_col.GetCell<int64_t>(i);
		if (n_param < 1) {
			FlatVector::SetNull(result, i, true);
			return;
		}

		//	Decrement as we go along.
		auto n = idx_t(n_param);

		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (n < frame_width) {
				const auto nth_index = gvstate.value_tree->SelectNth(frames, n - 1);
				if (nth_index.second) {
					// Past end of frame
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (const auto &frame : frames) {
			if (frame.start >= frame.end) {
				continue;
			}

			const auto nth_index = WindowBoundariesState::FindNextStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, nth_index, result, i);
				return;
			}
		}
		FlatVector::SetNull(result, i, true);
	});
}